

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

void __thiscall Gluco::Solver::removeSatisfied(Solver *this,vec<unsigned_int> *cs)

{
  uint cr;
  uint *puVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (cs->sz < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      puVar1 = cs->data;
      cr = puVar1[lVar5];
      if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) {
        __assert_fail("r >= 0 && r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                      ,0x42,
                      "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]")
        ;
      }
      bVar2 = satisfied(this,(Clause *)((this->ca).super_RegionAllocator<unsigned_int>.memory + cr))
      ;
      if (bVar2) {
        removeClause(this,cr);
      }
      else {
        lVar3 = (long)iVar4;
        iVar4 = iVar4 + 1;
        puVar1[lVar3] = cr;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < cs->sz);
    iVar4 = (int)lVar5 - iVar4;
  }
  vec<unsigned_int>::shrink(cs,iVar4);
  return;
}

Assistant:

void Solver::removeSatisfied(vec<CRef>& cs)
{
    int i, j;
    for (i = j = 0; i < cs.size(); i++){
        Clause& c = ca[cs[i]];
        if (satisfied(c)) 
            removeClause(cs[i]);
        else
            cs[j++] = cs[i];
    }
    cs.shrink(i - j);
}